

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* stringSplit(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,string *string,char delimiter)

{
  size_type sVar1;
  ulong uVar2;
  value_type local_80;
  value_type local_50;
  long local_30;
  size_type end;
  size_type start;
  string *psStack_18;
  char delimiter_local;
  string *string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  start._6_1_ = 0;
  start._7_1_ = delimiter;
  psStack_18 = string;
  string_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end = 0;
  while ((sVar1 = end, uVar2 = std::__cxx11::string::size(), sVar1 < uVar2 &&
         (local_30 = std::__cxx11::string::find((char)psStack_18,(ulong)(uint)(int)start._7_1_),
         local_30 != -1))) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)psStack_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    end = local_30 + 1;
  }
  std::__cxx11::string::substr((ulong)&local_80,(ulong)psStack_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> stringSplit(const std::string &string, const char delimiter)
{
    std::vector<std::string> ret;

    std::string::size_type start = 0;
    while (start < string.size()) {
        std::string::size_type end = string.find(delimiter, start);
        if (end == std::string::npos) {
            break;
        }
        ret.push_back(string.substr(start, end - start));
        start = end + 1;
    }
    ret.push_back(string.substr(start));

    return ret;
}